

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

errr finish_parse_meth(parser *p)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  angband_constants *paVar7;
  blow_method *pbVar8;
  void *pvVar9;
  undefined8 *p_00;
  uint16_t uVar10;
  long lVar11;
  long lVar12;
  
  z_info->blow_methods_max = 0;
  pvVar9 = parser_priv(p);
  paVar7 = z_info;
  uVar10 = z_info->blow_methods_max;
  for (; pvVar9 != (void *)0x0; pvVar9 = *(void **)((long)pvVar9 + 0x28)) {
    uVar10 = uVar10 + 1;
    paVar7->blow_methods_max = uVar10;
  }
  blow_methods = (blow_method *)mem_zalloc((ulong)uVar10 * 0x30 + 0x30);
  p_00 = (undefined8 *)parser_priv(p);
  lVar12 = 0x60;
  while (pbVar8 = blow_methods, p_00 != (undefined8 *)0x0) {
    lVar11 = (long)&blow_methods->name + lVar12;
    uVar2 = *p_00;
    uVar3 = p_00[1];
    uVar4 = p_00[2];
    uVar5 = p_00[3];
    uVar6 = p_00[5];
    puVar1 = (undefined8 *)((long)blow_methods + lVar12 + -0x10);
    *puVar1 = p_00[4];
    puVar1[1] = uVar6;
    puVar1 = (undefined8 *)((long)pbVar8 + lVar12 + -0x20);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    puVar1 = (undefined8 *)((long)&pbVar8[-1].name + lVar12);
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
    puVar1 = (undefined8 *)p_00[5];
    if (puVar1 == (undefined8 *)0x0) {
      lVar11 = 0;
    }
    *(long *)((long)pbVar8 + lVar12 + -8) = lVar11;
    mem_free(p_00);
    lVar12 = lVar12 + 0x30;
    p_00 = puVar1;
  }
  z_info->blow_methods_max = z_info->blow_methods_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_meth(struct parser *p) {
	struct blow_method *meth, *next = NULL;
	int count = 1;

	/* Count the entries */
	z_info->blow_methods_max = 0;
	meth = parser_priv(p);
	while (meth) {
		z_info->blow_methods_max++;
		meth = meth->next;
	}

	/* Allocate the direct access list and copy the data to it */
	blow_methods = mem_zalloc((z_info->blow_methods_max + 1) * sizeof(*meth));
	for (meth = parser_priv(p); meth; meth = next, count++) {
		memcpy(&blow_methods[count], meth, sizeof(*meth));
		next = meth->next;
		if (next)
			blow_methods[count].next = &blow_methods[count + 1];
		else
			blow_methods[count].next = NULL;

		mem_free(meth);
	}
	z_info->blow_methods_max += 1;

	parser_destroy(p);
	return 0;
}